

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O3

int Test_SUNMatScaleAddI2(SUNMatrix A,N_Vector x,N_Vector y)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  N_Vector x_00;
  N_Vector y_00;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  
  uVar3 = SUNMatClone();
  x_00 = (N_Vector)N_VClone(x);
  y_00 = (N_Vector)N_VClone(x);
  uVar1 = SUNMatCopy(A,uVar3);
  if (uVar1 == 0) {
    uVar1 = SUNMatScaleAddI(0xbff0000000000000,uVar3);
    if (uVar1 != 0) {
      pcVar6 = ">>> FAILED test -- SUNMatScaleAddI returned %d \n";
      goto LAB_00103a2d;
    }
    uVar1 = SUNMatMatvec(uVar3,x,x_00);
    if (uVar1 != 0) {
      pcVar6 = ">>> FAILED test -- SUNMatMatvec returned %d \n";
      goto LAB_00103a2d;
    }
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,x,y,y_00);
    iVar2 = check_vector(x_00,y_00,4.440892098500626e-14);
    if (iVar2 == 0) {
      puts("    PASSED test -- SUNMatScaleAddI2 check 1 ");
      uVar4 = SUNMatClone(A);
      SUNSparseMatrix_Reallocate(uVar4,*A->content + *(long *)((long)A->content + 0x10));
      uVar1 = SUNMatCopy(A,uVar4);
      uVar5 = uVar4;
      if (uVar1 == 0) {
        uVar1 = SUNMatScaleAddI(0xbff0000000000000,uVar4);
        if (uVar1 == 0) {
          uVar1 = SUNMatMatvec(uVar4,x,x_00);
          if (uVar1 == 0) {
            N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,x,y,y_00);
            iVar2 = check_vector(x_00,y_00,4.440892098500626e-14);
            if (iVar2 == 0) {
              puts("    PASSED test -- SUNMatScaleAddI2 check 2 ");
              uVar5 = SUNMatClone(uVar4);
              uVar1 = SUNMatCopy(uVar4,uVar5);
              if (uVar1 == 0) {
                uVar1 = SUNMatScaleAddI(0xbff0000000000000,uVar5);
                if (uVar1 == 0) {
                  uVar1 = SUNMatMatvec(uVar5,x,x_00);
                  if (uVar1 == 0) {
                    iVar2 = check_vector(x_00,y,4.440892098500626e-14);
                    if (iVar2 == 0) {
                      puts("    PASSED test -- SUNMatScaleAddI2 check 3 ");
                      SUNMatDestroy(uVar3);
                      SUNMatDestroy(uVar4);
                      iVar2 = 0;
                      goto LAB_00103a3b;
                    }
                    puts(">>> FAILED test -- SUNMatScaleAddI2 check 3 ");
                    puts("\nA =");
                    SUNSparseMatrix_Print(A,_stdout);
                    puts("\nD =");
                    SUNSparseMatrix_Print(uVar5,_stdout);
                    puts("\nz =");
                    N_VPrint_Serial(x_00);
                    puts("\ny =");
                    N_VPrint_Serial(y);
                    SUNMatDestroy(uVar3);
                    uVar3 = uVar4;
                    goto LAB_00103c55;
                  }
                  pcVar6 = ">>> FAILED test -- SUNMatMatvec returned %d \n";
                }
                else {
                  pcVar6 = ">>> FAILED test -- SUNMatScaleAddI returned %d \n";
                }
              }
              else {
                pcVar6 = ">>> FAILED test -- SUNMatCopy returned %d \n";
              }
              printf(pcVar6,(ulong)uVar1);
              SUNMatDestroy(uVar3);
              SUNMatDestroy(uVar4);
              iVar2 = 1;
            }
            else {
              puts(">>> FAILED test -- SUNMatScaleAddI2 check 2 ");
              puts("\nA =");
              SUNSparseMatrix_Print(A,_stdout);
              puts("\nC =");
              SUNSparseMatrix_Print(uVar4,_stdout);
              puts("\nz =");
              N_VPrint_Serial(x_00);
              puts("\nw =");
              N_VPrint_Serial(y_00);
LAB_00103c55:
              SUNMatDestroy(uVar3);
              iVar2 = 1;
            }
            goto LAB_00103a3b;
          }
          pcVar6 = ">>> FAILED test -- SUNMatMatvec returned %d \n";
        }
        else {
          pcVar6 = ">>> FAILED test -- SUNMatScaleAddI returned %d \n";
        }
      }
      else {
        pcVar6 = ">>> FAILED test -- SUNMatCopy returned %d \n";
      }
      printf(pcVar6,(ulong)uVar1);
      SUNMatDestroy(uVar3);
      iVar2 = 1;
      goto LAB_00103a3b;
    }
    puts(">>> FAILED test -- SUNMatScaleAddI2 check 1 ");
    puts("\nA =");
    SUNSparseMatrix_Print(A,_stdout);
    puts("\nB =");
    SUNSparseMatrix_Print(uVar3,_stdout);
    puts("\nz =");
    N_VPrint_Serial(x_00);
    puts("\nw =");
    N_VPrint_Serial(y_00);
  }
  else {
    pcVar6 = ">>> FAILED test -- SUNMatCopy returned %d \n";
LAB_00103a2d:
    printf(pcVar6,(ulong)uVar1);
  }
  iVar2 = 1;
  uVar5 = uVar3;
LAB_00103a3b:
  SUNMatDestroy(uVar5);
  N_VDestroy(x_00);
  N_VDestroy(y_00);
  return iVar2;
}

Assistant:

int Test_SUNMatScaleAddI2(SUNMatrix A, N_Vector x, N_Vector y)
{
  int failure;
  SUNMatrix B, C, D;
  N_Vector w, z;
  sunrealtype tol = 200 * SUN_UNIT_ROUNDOFF;

  /* create clones for test */
  B = SUNMatClone(A);
  z = N_VClone(x);
  w = N_VClone(x);

  /* test 1: add I to a matrix with insufficient storage */
  failure = SUNMatCopy(A, B);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n", failure);
    SUNMatDestroy(B);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = SUNMatScaleAddI(NEG_ONE, B); /* B = I-A */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n", failure);
    SUNMatDestroy(B);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = SUNMatMatvec(B, x, z);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n", failure);
    SUNMatDestroy(B);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  N_VLinearSum(ONE, x, NEG_ONE, y, w); /* B x = (I - A) x = x - Ax = x - y = w */
  failure = check_vector(z, w, tol);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAddI2 check 1 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A, stdout);
    printf("\nB =\n");
    SUNSparseMatrix_Print(B, stdout);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\nw =\n");
    N_VPrint_Serial(w);
    SUNMatDestroy(B);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  else { printf("    PASSED test -- SUNMatScaleAddI2 check 1 \n"); }

  /* test 2: add I to a matrix with sufficient but misplaced
     storage */
  C       = SUNMatClone(A);
  failure = SUNSparseMatrix_Reallocate(C, SM_NNZ_S(A) + SM_ROWS_S(A));
  failure = SUNMatCopy(A, C);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n", failure);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = SUNMatScaleAddI(NEG_ONE, C); /* C = I-A */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n", failure);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = SUNMatMatvec(C, x, z);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n", failure);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  N_VLinearSum(ONE, x, NEG_ONE, y, w);
  failure = check_vector(z, w, tol);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAddI2 check 2 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A, stdout);
    printf("\nC =\n");
    SUNSparseMatrix_Print(C, stdout);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\nw =\n");
    N_VPrint_Serial(w);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  else { printf("    PASSED test -- SUNMatScaleAddI2 check 2 \n"); }

  /* test 3: add I to a matrix with appropriate structure already in place */
  D       = SUNMatClone(C);
  failure = SUNMatCopy(C, D);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n", failure);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = SUNMatScaleAddI(NEG_ONE, D); /* D = A */
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n", failure);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = SUNMatMatvec(D, x, z);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n", failure);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  failure = check_vector(z, y, tol);
  if (failure)
  {
    printf(">>> FAILED test -- SUNMatScaleAddI2 check 3 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A, stdout);
    printf("\nD =\n");
    SUNSparseMatrix_Print(D, stdout);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\ny =\n");
    N_VPrint_Serial(y);
    SUNMatDestroy(B);
    SUNMatDestroy(C);
    SUNMatDestroy(D);
    N_VDestroy(z);
    N_VDestroy(w);
    return (1);
  }
  else { printf("    PASSED test -- SUNMatScaleAddI2 check 3 \n"); }

  SUNMatDestroy(B);
  SUNMatDestroy(C);
  SUNMatDestroy(D);
  N_VDestroy(z);
  N_VDestroy(w);
  return (0);
}